

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void __thiscall
duckdb::RLECompressState<duckdb::hugeint_t,_true>::WriteValue
          (RLECompressState<duckdb::hugeint_t,_true> *this,hugeint_t value,rle_count_t count,
          bool is_null)

{
  __int_type _Var1;
  __int_type _Var2;
  hugeint_t new_value;
  data_ptr_t pdVar3;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  pointer pCVar4;
  ushort in_CX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  __atomic_base<unsigned_long> *in_RDI;
  byte in_R8B;
  unsigned_long row_start;
  RLECompressState<duckdb::hugeint_t,_true> *in_stack_00000020;
  rle_count_t *index_pointer;
  hugeint_t *data_pointer;
  data_ptr_t handle_ptr;
  BaseStatistics *in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffb0;
  
  pdVar3 = BufferHandle::Ptr((BufferHandle *)0xa53834);
  _Var1 = in_RDI[0xf]._M_i;
  _Var2 = in_RDI[0xe]._M_i;
  *(undefined8 *)(pdVar3 + _Var2 * 0x10 + 8) = in_RSI;
  *(undefined8 *)(pdVar3 + _Var2 * 0x10 + 8 + 8) = in_RDX;
  *(ushort *)(pdVar3 + in_RDI[0xe]._M_i * 2 + _Var1 * 0x10 + 8) = in_CX;
  in_RDI[0xe]._M_i = in_RDI[0xe]._M_i + 1;
  if ((in_R8B & 1) == 0) {
    unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
              ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                *)in_stack_ffffffffffffffa0);
    new_value.upper = in_stack_ffffffffffffffb0;
    new_value.lower = (uint64_t)in_RDI;
    BaseStatistics::UpdateNumericStats<duckdb::hugeint_t>(in_stack_ffffffffffffffa0,new_value);
  }
  this_00 = (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
            (ulong)in_CX;
  pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  ::std::__atomic_base<unsigned_long>::operator+=
            (&(pCVar4->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>,(__int_type)this_00);
  if (in_RDI[0xe]._M_i == in_RDI[0xf]._M_i) {
    unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
              (this_00);
    unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
              (this_00);
    ::std::__atomic_base::operator_cast_to_unsigned_long(in_RDI);
    FlushSegment(in_stack_00000020);
    CreateEmptySegment((RLECompressState<duckdb::hugeint_t,_true> *)handle_ptr,(idx_t)data_pointer);
    in_RDI[0xe]._M_i = 0;
  }
  return;
}

Assistant:

void WriteValue(T value, rle_count_t count, bool is_null) {
		// write the RLE entry
		auto handle_ptr = handle.Ptr() + RLEConstants::RLE_HEADER_SIZE;
		auto data_pointer = reinterpret_cast<T *>(handle_ptr);
		auto index_pointer = reinterpret_cast<rle_count_t *>(handle_ptr + max_rle_count * sizeof(T));
		data_pointer[entry_count] = value;
		index_pointer[entry_count] = count;
		entry_count++;

		// update meta data
		if (WRITE_STATISTICS && !is_null) {
			current_segment->stats.statistics.UpdateNumericStats<T>(value);
		}
		current_segment->count += count;

		if (entry_count == max_rle_count) {
			// we have finished writing this segment: flush it and create a new segment
			auto row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
			entry_count = 0;
		}
	}